

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::FillPatchIteratorHelper::Initialize
          (FillPatchIteratorHelper *this,int boxGrow,Real time,int idx,int scomp,int ncomp,
          InterpBase *mapper)

{
  undefined1 *__x;
  _Rb_tree_header *__pos;
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  int iVar5;
  AmrLevel *pAVar6;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var7;
  element_type *peVar8;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var9;
  value_type *pvVar10;
  pointer pBVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> __first;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> __last;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> __first_00;
  pointer pIVar15;
  bool extrap;
  bool bVar16;
  int dir;
  IndexType _btype;
  uint uVar17;
  Interpolater *pIVar18;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  *pVVar19;
  StateDescriptor *this_00;
  Box *this_01;
  ulong uVar20;
  iterator iVar21;
  iterator iVar22;
  mapped_type *pmVar23;
  mapped_type *pmVar24;
  mapped_type *pmVar25;
  Box *pBVar26;
  ulong uVar27;
  _Rb_tree_node_base *p_Var28;
  long lVar29;
  byte bVar30;
  Box *pBVar31;
  int iVar32;
  vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
  *this_02;
  long lVar33;
  int l;
  long lVar34;
  int index;
  ulong uVar35;
  value_type *__x_00;
  long lVar36;
  IntVect *iv;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *pvVar37;
  pointer pIVar38;
  Box shbox;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> unfilledThisLevel;
  BoxList bl;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> crse_boxes;
  int bxidx;
  BoxList unfillableThisLevel;
  Interpolater **local_b8;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> pshifts;
  BoxList tempUnfillable;
  
  if (mapper == (InterpBase *)0x0) {
    this->m_map = (Interpolater *)0x0;
  }
  else {
    pIVar18 = (Interpolater *)__dynamic_cast(mapper,&InterpBase::typeinfo,&Interpolater::typeinfo,0)
    ;
    this->m_map = pIVar18;
    if (pIVar18 != (Interpolater *)0x0) goto LAB_00570bd3;
  }
  Assert_host("m_map",
              "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Amr/AMReX_AmrLevel.cpp"
              ,0x2ec,"\"Cannot use MFInterpolater without proper nesting\"");
LAB_00570bd3:
  local_b8 = &this->m_map;
  this->m_time = time;
  this->m_growsize = boxGrow;
  this->m_index = idx;
  this->m_scomp = scomp;
  this->m_ncomp = ncomp;
  pAVar6 = this->m_amrlevel;
  cVar4 = (pAVar6->geom).super_CoordSys.field_0x52;
  if ((pAVar6->geom).super_CoordSys.field_0x51 == '\0') {
    bVar30 = true;
    if (cVar4 == '\0') {
      bVar30 = (pAVar6->geom).super_CoordSys.field_0x53;
    }
  }
  else {
    bVar30 = true;
    if (cVar4 != '\0') {
      bVar30 = (pAVar6->geom).super_CoordSys.field_0x53 ^ 1;
    }
  }
  this->m_FixUpCorners = (bool)bVar30;
  iVar32 = *(int *)(ParallelContext::frames + 0xc);
  pVVar19 = Amr::getAmrLevels(pAVar6->parent);
  _Var7.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (pVVar19->
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[this->m_amrlevel->level]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  iVar5 = this->m_index;
  lVar29 = *(long *)((long)_Var7.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170);
  _btype = BATransformer::index_type
                     (&(this->m_leveldata->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                       boxarray.m_bat);
  this_00 = DescriptorList::operator[]((DescriptorList *)AmrLevel::desc_lst,this->m_index);
  extrap = StateDescriptor::extrap(this_00);
  lVar33 = 0;
  for (lVar34 = 0; lVar34 <= this->m_amrlevel->level; lVar34 = lVar34 + 1) {
    StateData::RegisterData
              ((StateData *)
               ((long)this->m_index * 0xe0 +
               *(long *)((long)(pVVar19->
                               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               ).
                               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar34]._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0x170)),&this->m_mfcd,
               (Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
               ((long)&(((this->m_mfid).
                         super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
                       super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar33));
    lVar33 = lVar33 + 0x18;
  }
  this_01 = (Box *)((long)iVar5 * 0xe0 + lVar29 + 0x10);
  peVar8 = (this->m_leveldata->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar20 = ((long)(peVar8->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           *(long *)&(peVar8->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data) / 0x1c;
  __pos = &(this->m_ba)._M_t._M_impl.super__Rb_tree_header;
  uVar35 = 0;
  uVar27 = uVar20 & 0xffffffff;
  if ((int)uVar20 < 1) {
    uVar27 = uVar35;
  }
  for (; uVar27 != uVar35; uVar35 = uVar35 + 1) {
    if (*(int *)(*(long *)&(((this->m_leveldata->super_FabArray<amrex::FArrayBox>).
                             super_FabArrayBase.distributionMap.m_ref.
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar35 * 4) ==
        iVar32) {
      index = (int)uVar35;
      tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tempUnfillable.btype.itype = 0;
      tempUnfillable._28_4_ = 0;
      unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = index;
      std::
      vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
      ::~vector((vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                 *)&unfillableThisLevel);
      iVar21 = std::
               _Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>>
               ::
               _M_emplace_hint_unique<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>&>
                         ((_Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>>
                           *)&this->m_fbid,
                          (const_iterator)&(this->m_fbid)._M_t._M_impl.super__Rb_tree_header,
                          (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>
                           *)&tempUnfillable);
      std::
      vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
      ::resize((vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                *)&iVar21._M_node[1]._M_parent,(long)this->m_amrlevel->level + 1);
      unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      unfillableThisLevel.btype.itype = 0;
      unfillableThisLevel._28_4_ = 0;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = index;
      std::
      vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::~vector((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                 *)&bl);
      iVar22 = std::
               _Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
               ::
               _M_emplace_hint_unique<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>&>
                         ((_Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
                           *)&this->m_fbox,
                          (const_iterator)&(this->m_fbox)._M_t._M_impl.super__Rb_tree_header,
                          (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
                           *)&unfillableThisLevel);
      std::
      vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::resize((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                *)&iVar22._M_node[1]._M_parent,(long)this->m_amrlevel->level + 1);
      iVar22 = std::
               _Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
               ::
               _M_emplace_hint_unique<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>&>
                         ((_Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
                           *)&this->m_cbox,
                          (const_iterator)&(this->m_cbox)._M_t._M_impl.super__Rb_tree_header,
                          (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
                           *)&unfillableThisLevel);
      std::
      vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::resize((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                *)&iVar22._M_node[1]._M_parent,(long)this->m_amrlevel->level + 1);
      BoxArray::operator[]
                (&shbox,&(this->m_leveldata->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                         boxarray,index);
      iVar5 = this->m_growsize;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = shbox.smallend.vect[0] - iVar5;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = shbox.smallend.vect[1] - iVar5;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = shbox.smallend.vect[2] - iVar5;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = shbox.bigend.vect[0] + iVar5;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = iVar5 + shbox.bigend.vect[1];
      bl.btype.itype = iVar5 + shbox.bigend.vect[2];
      bl._28_4_ = shbox.btype.itype;
      bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = index;
      std::
      _Rb_tree<int,std::pair<int_const,amrex::Box>,std::_Select1st<std::pair<int_const,amrex::Box>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Box>>>
      ::_M_insert_unique_<std::pair<int_const,amrex::Box>>
                ((_Rb_tree<int,std::pair<int_const,amrex::Box>,std::_Select1st<std::pair<int_const,amrex::Box>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Box>>>
                  *)&this->m_ba,(const_iterator)__pos,(pair<const_int,_amrex::Box> *)&bl);
      std::
      vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::~vector((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                 *)&unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                    .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      std::
      vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
      ::~vector((vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                 *)&tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    }
  }
  BoxList::BoxList(&tempUnfillable,_btype);
  BoxList::BoxList(&unfillableThisLevel,_btype);
  unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            (&pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,0x1b,
             (allocator_type *)&bl);
  for (p_Var28 = (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var28 != __pos;
      p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
    bxidx = p_Var28[1]._M_color;
    if (unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    __x = &p_Var28[1].field_0x4;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              (&unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,
               (value_type *)__x);
    bVar16 = Box::contains(this_01,(Box *)__x);
    if ((!bVar16) &&
       (((Box::operator&=(unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1,this_01),
         *(char *)((long)_Var7.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x61) !=
         '\0' || (*(char *)((long)_Var7.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0x62) != '\0')) ||
        (*(char *)((long)_Var7.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 99) ==
         '\x01')))) {
      Geometry::periodicShift
                ((Geometry *)
                 ((long)_Var7.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10),
                 this_01,(Box *)__x,&pshifts);
      pIVar15 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pIVar38 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start; pIVar38 != pIVar15; pIVar38 = pIVar38 + 1) {
        shbox.smallend.vect._0_8_ = *(undefined8 *)__x;
        uVar12 = *(undefined8 *)((long)&p_Var28[1]._M_parent + 4);
        shbox.bigend.vect[1] = (int)((ulong)p_Var28[1]._M_left >> 0x20);
        shbox.bigend.vect[2] = (int)p_Var28[1]._M_right;
        shbox.btype.itype = (uint)((ulong)p_Var28[1]._M_right >> 0x20);
        shbox.smallend.vect[2] = (int)uVar12;
        shbox.bigend.vect[0] = (int)((ulong)uVar12 >> 0x20);
        Box::operator+=(&shbox,pIVar38);
        Box::operator&=(&shbox,this_01);
        if (_btype.itype == 7) {
          for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
            pBVar26 = (Box *)&shbox.bigend;
            iVar32 = -1;
            if ((0 < pIVar38->vect[lVar29]) ||
               (iVar32 = 1, pBVar26 = &shbox, pIVar38->vect[lVar29] < 0)) {
              piVar1 = (pBVar26->smallend).vect + lVar29;
              *piVar1 = *piVar1 + iVar32;
            }
          }
        }
        if (((shbox.smallend.vect[0] <= shbox.bigend.vect[0]) &&
            (shbox.smallend.vect[1] <= shbox.bigend.vect[1])) &&
           ((shbox.smallend.vect[2] <= shbox.bigend.vect[2] && (shbox.btype.itype < 8)))) {
          boxDiff(&bl,&shbox,(Box *)__x);
          __first._M_current._4_4_ =
               bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
          __first._M_current._0_4_ =
               (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start;
          __last._M_current._4_4_ =
               bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_;
          __last._M_current._0_4_ =
               (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          std::vector<amrex::Box,std::allocator<amrex::Box>>::
          insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&unfilledThisLevel,
                     (const_iterator)
                     unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish,__first,__last);
          std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                    ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl);
        }
      }
    }
    pmVar23 = std::
              map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
              ::operator[](&this->m_cbox,&bxidx);
    pmVar24 = std::
              map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
              ::operator[](&this->m_fbox,&bxidx);
    pmVar25 = std::
              map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
              ::operator[](&this->m_fbid,&bxidx);
    uVar17 = this->m_amrlevel->level;
    bVar16 = false;
    while ((-1 < (int)uVar17 && (!bVar16))) {
      BoxList::clear(&unfillableThisLevel);
      _Var9.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (pVVar19->
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      cVar4 = '\x01';
      if ((*(char *)((long)_Var9.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x61) ==
           '\0') &&
         (*(char *)((long)_Var9.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x62) ==
          '\0')) {
        cVar4 = *(char *)((long)_Var9.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 99);
      }
      iVar32 = this->m_index;
      lVar29 = *(long *)((long)_Var9.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170
                        );
      pvVar37 = &(pmVar24->
                 super_vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::operator=
                (pvVar37,&unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>);
      if (crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start) {
        crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      lVar33 = (long)iVar32 * 0xe0;
      pBVar26 = (Box *)(lVar33 + lVar29 + 0x10);
      pvVar10 = (pvVar37->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (__x_00 = (pvVar37->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
                    super__Vector_impl_data._M_start; __x_00 != pvVar10; __x_00 = __x_00 + 1) {
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  (&crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,__x_00);
        if (uVar17 != this->m_amrlevel->level) {
          (*((*local_b8)->super_InterpBase)._vptr_InterpBase[3])
                    (&bl,*local_b8,__x_00,
                     (long)_Var9.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x164);
          *(ulong *)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].bigend.vect =
               CONCAT44((int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish._4_4_);
          *(ulong *)(crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].bigend.vect + 2) =
               CONCAT44(bl.btype.itype,
                        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
          *(ulong *)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].smallend.vect =
               CONCAT44(bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start);
          *(ulong *)(crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].smallend.vect + 2) =
               CONCAT44(bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish._4_4_,
                        (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish);
          if ((cVar4 != '\0') && (bVar16 = Box::contains(pBVar26,(Box *)&bl), !bVar16)) {
            Geometry::periodicShift
                      ((Geometry *)
                       ((long)_Var9.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10),
                       pBVar26,(Box *)&bl,&pshifts);
            pIVar15 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (pIVar38 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           _M_impl.super__Vector_impl_data._M_start; pIVar38 != pIVar15;
                pIVar38 = pIVar38 + 1) {
              shbox.smallend.vect[1] =
                   bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_;
              shbox.smallend.vect[0] =
                   (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start;
              shbox.bigend.vect[1] =
                   (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              shbox.bigend.vect[2] =
                   bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
              shbox.btype = bl.btype;
              shbox.smallend.vect[2] =
                   (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              shbox.bigend.vect[0] =
                   bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_4_;
              Box::operator+=(&shbox,pIVar38);
              Box::operator&=(&shbox,pBVar26);
              if (_btype.itype == 7) {
                for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
                  pBVar31 = (Box *)&shbox.bigend;
                  iVar32 = -1;
                  if ((0 < pIVar38->vect[lVar34]) ||
                     (iVar32 = 1, pBVar31 = &shbox, pIVar38->vect[lVar34] < 0)) {
                    piVar1 = (pBVar31->smallend).vect + lVar34;
                    *piVar1 = *piVar1 + iVar32;
                  }
                }
              }
              if ((((shbox.smallend.vect[0] <= shbox.bigend.vect[0]) &&
                   (shbox.smallend.vect[1] <= shbox.bigend.vect[1])) &&
                  (shbox.smallend.vect[2] <= shbox.bigend.vect[2])) && (shbox.btype.itype < 8)) {
                std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                          (&crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,&shbox)
                ;
              }
            }
          }
        }
      }
      this_02 = &(pmVar25->
                 super_vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].
                 super_vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
      ;
      pvVar37 = &(pmVar23->
                 super_vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
      std::
      vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
      ::resize(this_02,((long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x1c);
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::resize
                (pvVar37,((long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x1c);
      uVar27 = ((long)(pvVar37->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
               (long)(pvVar37->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x1c;
      uVar20 = uVar27 & 0xffffffff;
      if ((int)uVar27 < 1) {
        uVar20 = 0;
      }
      lVar36 = 0;
      for (lVar34 = 0; uVar20 * 0x18 != lVar34; lVar34 = lVar34 + 0x18) {
        pBVar11 = (pvVar37->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar2 = (undefined8 *)
                 ((long)((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start)->smallend).vect + lVar36);
        uVar12 = *puVar2;
        uVar13 = puVar2[1];
        puVar2 = (undefined8 *)
                 ((long)((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start)->bigend).vect + lVar36);
        uVar14 = puVar2[1];
        puVar3 = (undefined8 *)((long)(pBVar11->bigend).vect + lVar36);
        *puVar3 = *puVar2;
        puVar3[1] = uVar14;
        puVar2 = (undefined8 *)((long)(pBVar11->smallend).vect + lVar36);
        *puVar2 = uVar12;
        puVar2[1] = uVar13;
        StateData::InterpAddBox
                  ((StateData *)(lVar29 + lVar33),&this->m_mfcd,
                   (this->m_mfid).
                   super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17,&tempUnfillable,
                   (Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                   ((long)&(((this_02->
                             super__Vector_base<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
                           super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar34),
                   (Box *)((long)(((pvVar37->
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->smallend).vect +
                          lVar36),this->m_time,this->m_scomp,0,this->m_ncomp,extrap);
        BoxList::catenate(&unfillableThisLevel,&tempUnfillable);
        lVar36 = lVar36 + 0x1c;
      }
      BoxList::intersect(&unfillableThisLevel,pBVar26);
      __first_00._M_current._4_4_ =
           unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
      __first_00._M_current._0_4_ =
           (int)unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar16 = __first_00._M_current ==
               unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (!bVar16) {
        if (unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start) {
          unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish =
               unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<amrex::Box,std::allocator<amrex::Box>>::
        insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&unfilledThisLevel,
                   (const_iterator)
                   unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish,__first_00,
                   (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    )unfillableThisLevel.m_lbox.
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish);
      }
      uVar17 = uVar17 - 1;
    }
  }
  (this->m_mfcd).super_FabArrayCopyDescriptor<amrex::FArrayBox>.dataAvailable = true;
  std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
            ((_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&pshifts);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&crse_boxes);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&unfilledThisLevel);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&unfillableThisLevel);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&tempUnfillable);
  return;
}

Assistant:

void
FillPatchIteratorHelper::Initialize (int           boxGrow,
                                     Real          time,
                                     int           idx,
                                     int           scomp,
                                     int           ncomp,
                                     InterpBase*   mapper)
{
    BL_PROFILE("FillPatchIteratorHelper::Initialize()");

    BL_ASSERT(mapper);
    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(AmrLevel::desc_lst[idx].inRange(scomp,ncomp));
    BL_ASSERT(0 <= idx && idx < AmrLevel::desc_lst.size());

    m_map          = dynamic_cast<Interpolater*>(mapper);
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_map, "Cannot use MFInterpolater without proper nesting");
    m_time         = time;
    m_growsize     = boxGrow;
    m_index        = idx;
    m_scomp        = scomp;
    m_ncomp        = ncomp;
    m_FixUpCorners = NeedToTouchUpPhysCorners(m_amrlevel.geom);

    const int         MyProc     = ParallelDescriptor::MyProc();
    auto&             amrLevels  = m_amrlevel.parent->getAmrLevels();
    const AmrLevel&   topLevel   = *amrLevels[m_amrlevel.level];
    const Box&        topPDomain = topLevel.state[m_index].getDomain();
    const IndexType&  boxType    = m_leveldata.boxArray().ixType();
    const bool        extrap     = AmrLevel::desc_lst[m_index].extrap();
    //
    // Check that the interpolaters are identical.
    //
    BL_ASSERT(AmrLevel::desc_lst[m_index].identicalInterps(scomp,ncomp));

    for (int l = 0; l <= m_amrlevel.level; ++l)
    {
        amrLevels[l]->state[m_index].RegisterData(m_mfcd, m_mfid[l]);
    }
    for (int i = 0, N = m_leveldata.boxArray().size(); i < N; ++i)
    {
        //
        // A couple typedefs we'll use in the next code segment.
        //
        typedef std::map<int,Vector<Vector<Box> > >::value_type IntAABoxMapValType;

        typedef std::map<int,Vector<Vector<Vector<FillBoxId> > > >::value_type IntAAAFBIDMapValType;

        if (m_leveldata.DistributionMap()[i] != MyProc) continue;
        //
        // Insert with a hint since the indices are ordered lowest to highest.
        //
        IntAAAFBIDMapValType v1(i,Vector<Vector<Vector<FillBoxId> > >());

        m_fbid.insert(m_fbid.end(),v1)->second.resize(m_amrlevel.level+1);

        IntAABoxMapValType v2(i,Vector<Vector<Box> >());

        m_fbox.insert(m_fbox.end(),v2)->second.resize(m_amrlevel.level+1);
        m_cbox.insert(m_cbox.end(),v2)->second.resize(m_amrlevel.level+1);

        m_ba.insert(m_ba.end(),std::map<int,Box>::value_type(i,amrex::grow(m_leveldata.boxArray()[i],m_growsize)));
    }

    BoxList        tempUnfillable(boxType);
    BoxList        unfillableThisLevel(boxType);
    Vector<Box>     unfilledThisLevel;
    Vector<Box>     crse_boxes;
    Vector<IntVect> pshifts(27);

    for (std::map<int,Box>::const_iterator it = m_ba.begin(), End = m_ba.end();
         it != End;
         ++it)
    {
        const int  bxidx = it->first;
        const Box& box   = it->second;

        unfilledThisLevel.clear();
        unfilledThisLevel.push_back(box);

        if (!topPDomain.contains(box))
        {
            unfilledThisLevel.back() &= topPDomain;

            if (topLevel.geom.isAnyPeriodic())
            {
                //
                // May need to add additional unique pieces of valid region
                // in order to do periodic copies into ghost cells.
                //
                topLevel.geom.periodicShift(topPDomain,box,pshifts);

                for (const auto& iv : pshifts)
                {
                    Box shbox = box + iv;
                    shbox    &= topPDomain;

                    if (boxType.nodeCentered())
                    {
                        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                        {
                            if (iv[dir] > 0)
                            {
                                shbox.growHi(dir,-1);
                            }
                            else if (iv[dir] < 0)
                            {
                                shbox.growLo(dir,-1);
                            }
                        }
                    }

                    if (shbox.ok())
                    {
                        BoxList bl = amrex::boxDiff(shbox,box);

                        unfilledThisLevel.insert(unfilledThisLevel.end(), bl.begin(), bl.end());
                    }
                }
            }
        }

        // cells outside physical boundaries are not included in unfilledThisLevel

        bool Done = false;

        Vector< Vector<Box> >&                TheCrseBoxes = m_cbox[bxidx];
        Vector< Vector<Box> >&                TheFineBoxes = m_fbox[bxidx];
        Vector< Vector< Vector<FillBoxId> > >& TheFBIDs     = m_fbid[bxidx];

        for (int l = m_amrlevel.level; l >= 0 && !Done; --l)
        {
            unfillableThisLevel.clear();

            AmrLevel&       theAmrLevel = *amrLevels[l];
            StateData&      theState    = theAmrLevel.state[m_index];
            const Box&      thePDomain  = theState.getDomain();
            const Geometry& theGeom     = theAmrLevel.geom;
            const bool      is_periodic = theGeom.isAnyPeriodic();
            const IntVect&  fine_ratio  = theAmrLevel.fine_ratio;
            Vector<Box>&     FineBoxes   = TheFineBoxes[l];
            //
            // These are the boxes on this level contained in thePDomain
            // that need to be filled in order to directly fill at the
            // highest level or to interpolate up to the next higher level.
            //
            FineBoxes = unfilledThisLevel;
            //
            // Now build coarse boxes needed to interpolate to fine.
            //
            // If we're periodic and we're not at the finest level, we may
            // need to get some additional data at this level in order to
            // properly fill the CoarseBox()d versions of the fineboxes.
            //
            crse_boxes.clear();

            for (const auto& fbx : FineBoxes)
            {
                crse_boxes.push_back(fbx);

                if (l != m_amrlevel.level)
                {
                    const Box& cbox = m_map->CoarseBox(fbx,fine_ratio);

                    crse_boxes.back() = cbox;

                    if (is_periodic && !thePDomain.contains(cbox))
                    {
                        theGeom.periodicShift(thePDomain,cbox,pshifts);

                        for (const auto& iv : pshifts)
                        {
                            Box shbox = cbox + iv;
                            shbox    &= thePDomain;

                            if (boxType.nodeCentered())
                            {
                                for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                                {
                                    if (iv[dir] > 0)
                                    {
                                        shbox.growHi(dir,-1);
                                    }
                                    else if (iv[dir] < 0)
                                    {
                                        shbox.growLo(dir,-1);
                                    }
                                }
                            }

                            if (shbox.ok())
                            {
                                crse_boxes.push_back(shbox);
                            }
                        }
                    }
                }
            }

            Vector< Vector<FillBoxId> >& FBIDs     = TheFBIDs[l];
            Vector<Box>&                CrseBoxes = TheCrseBoxes[l];

            FBIDs.resize(crse_boxes.size());
            CrseBoxes.resize(crse_boxes.size());
            //
            // Now attempt to get as much coarse data as possible.
            //
            for (int i = 0, M = CrseBoxes.size(); i < M; i++)
            {
                BL_ASSERT(tempUnfillable.isEmpty());

                CrseBoxes[i] = crse_boxes[i];

                BL_ASSERT(CrseBoxes[i].intersects(thePDomain));

                theState.InterpAddBox(m_mfcd,
                                      m_mfid[l],
                                      &tempUnfillable,
                                      FBIDs[i],
                                      CrseBoxes[i],
                                      m_time,
                                      m_scomp,
                                      0,
                                      m_ncomp,
                                      extrap);

                unfillableThisLevel.catenate(tempUnfillable);
            }

            unfillableThisLevel.intersect(thePDomain);

            if (unfillableThisLevel.isEmpty())
            {
                Done = true;
            }
            else
            {
                unfilledThisLevel.clear();

                unfilledThisLevel.insert(unfilledThisLevel.end(),
                                         unfillableThisLevel.begin(),
                                         unfillableThisLevel.end());
            }
        }
    }

    m_mfcd.CollectData();
}